

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O0

void __thiscall
argstest::
MapFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MappingEnum,_argstest::ValueReader,_argstest::detail::unordered_map>
::MapFlag(MapFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MappingEnum,_argstest::ValueReader,_argstest::detail::unordered_map>
          *this,Group *group_,string *name_,string *help_,Matcher *matcher_,
         unordered_map<std::__cxx11::basic_string<char>,_MappingEnum> *map_,
         MappingEnum *defaultValue_,Options options_)

{
  unordered_map<std::__cxx11::basic_string<char>,_MappingEnum> *map__local;
  Matcher *matcher__local;
  string *help__local;
  string *name__local;
  Group *group__local;
  MapFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MappingEnum,_argstest::ValueReader,_argstest::detail::unordered_map>
  *this_local;
  
  ValueFlagBase::ValueFlagBase(&this->super_ValueFlagBase,name_,help_,matcher_,options_);
  (this->super_ValueFlagBase).super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)&PTR__MapFlag_00369b80;
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MappingEnum,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MappingEnum>_>_>
  ::unordered_map(&this->map,map_);
  this->value = *defaultValue_;
  this->defaultValue = *defaultValue_;
  Group::Add(group_,(Base *)this);
  return;
}

Assistant:

MapFlag(Group &group_, const std::string &name_, const std::string &help_, Matcher &&matcher_, const Map<K, T> &map_, const T &defaultValue_, Options options_): ValueFlagBase(name_, help_, std::move(matcher_), options_), map(map_), value(defaultValue_), defaultValue(defaultValue_)
            {
                group_.Add(*this);
            }